

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.h
# Opt level: O0

uint64_t farmhash128_to_64(uint128_c_t x)

{
  uint128_c_t x_00;
  uint128_c_t x_01;
  uint128_c_t x_02;
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t in_RSI;
  uint64_t in_RDI;
  uint64_t b;
  uint64_t a;
  uint64_t k_mul;
  
  x_00.b = in_RSI;
  x_00.a = in_RDI;
  uVar1 = uint128_c_t_low64(x_00);
  x_01.b = in_RSI;
  x_01.a = in_RDI;
  uVar2 = uint128_c_t_high64(x_01);
  uVar3 = (uVar1 ^ uVar2) * -0x622015f714c7d297;
  x_02.b = in_RSI;
  x_02.a = in_RDI;
  uVar1 = uint128_c_t_high64(x_02);
  uVar3 = (uVar1 ^ uVar3 >> 0x2f ^ uVar3) * -0x622015f714c7d297;
  return (uVar3 >> 0x2f ^ uVar3) * -0x622015f714c7d297;
}

Assistant:

static inline uint64_t farmhash128_to_64(uint128_c_t x) {
  // Murmur-inspired hashing.
  const uint64_t k_mul = 0x9ddfea08eb382d69ULL;
  uint64_t a = (uint128_c_t_low64(x) ^ uint128_c_t_high64(x)) * k_mul;
  a ^= (a >> 47);
  uint64_t b = (uint128_c_t_high64(x) ^ a) * k_mul;
  b ^= (b >> 47);
  b *= k_mul;
  return b;
}